

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudio_CreateSubmixVoice
                   (FAudio *audio,FAudioSubmixVoice **ppSubmixVoice,uint32_t InputChannels,
                   uint32_t InputSampleRate,uint32_t Flags,uint32_t ProcessingStage,
                   FAudioVoiceSends *pSendList,FAudioEffectChain *pEffectChain)

{
  FAudioVoice *voice;
  undefined1 auVar1 [16];
  FAudioSubmixVoice *pFVar2;
  FAudioMutex pvVar3;
  FAudioResampleCallback *pp_Var4;
  code *pcVar5;
  float *pfVar6;
  FAudioFilterState *pafVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  long lVar14;
  
  pFVar2 = (FAudioSubmixVoice *)(*audio->pMalloc)(0x148);
  *ppSubmixVoice = pFVar2;
  SDL_memset(pFVar2,0,0x148);
  (*ppSubmixVoice)->audio = audio;
  pFVar2 = *ppSubmixVoice;
  pFVar2->type = FAUDIO_VOICE_SUBMIX;
  pFVar2->flags = Flags;
  (pFVar2->filter).Type = FAudioLowPassFilter;
  (pFVar2->filter).Frequency = 1.0;
  (pFVar2->filter).OneOverQ = 1.0;
  pvVar3 = FAudio_PlatformCreateMutex();
  (*ppSubmixVoice)->sendLock = pvVar3;
  pvVar3 = FAudio_PlatformCreateMutex();
  (*ppSubmixVoice)->effectLock = pvVar3;
  pvVar3 = FAudio_PlatformCreateMutex();
  (*ppSubmixVoice)->filterLock = pvVar3;
  pvVar3 = FAudio_PlatformCreateMutex();
  (*ppSubmixVoice)->volumeLock = pvVar3;
  ((*ppSubmixVoice)->field_19).mix.inputChannels = InputChannels;
  ((*ppSubmixVoice)->field_19).mix.inputSampleRate = InputSampleRate;
  ((*ppSubmixVoice)->field_19).src.curBufferOffset = ProcessingStage;
  if (InputChannels == 2) {
    pp_Var4 = &FAudio_INTERNAL_ResampleStereo;
  }
  else {
    if (InputChannels != 1) {
      pcVar5 = FAudio_INTERNAL_ResampleGeneric;
      goto LAB_00114e90;
    }
    pp_Var4 = &FAudio_INTERNAL_ResampleMono;
  }
  pcVar5 = *pp_Var4;
LAB_00114e90:
  ((*ppSubmixVoice)->field_19).mix.resample = pcVar5;
  dVar10 = (double)SDL_ceil(((double)InputSampleRate * (double)audio->updateSize) /
                            (double)(audio->master->field_19).master.inputSampleRate);
  ((*ppSubmixVoice)->field_19).src.decodeSamples = ((int)(long)dVar10 + 2) * InputChannels;
  pfVar6 = (float *)(*audio->pMalloc)((ulong)((*ppSubmixVoice)->field_19).src.decodeSamples << 2);
  ((*ppSubmixVoice)->field_19).mix.inputCache = pfVar6;
  SDL_memset(((*ppSubmixVoice)->field_19).mix.inputCache,0,
             (ulong)((*ppSubmixVoice)->field_19).src.decodeSamples << 2);
  FAudio_INTERNAL_VoiceOutputFrequency(*ppSubmixVoice,pSendList);
  FAudioVoice_SetEffectChain(*ppSubmixVoice,pEffectChain);
  pFVar2 = *ppSubmixVoice;
  pFVar2->volume = 1.0;
  pfVar6 = (float *)(*audio->pMalloc)((ulong)pFVar2->outputChannels << 2);
  (*ppSubmixVoice)->channelVolume = pfVar6;
  auVar1 = _DAT_00126030;
  voice = *ppSubmixVoice;
  uVar8 = (ulong)voice->outputChannels;
  if (uVar8 != 0) {
    pfVar6 = voice->channelVolume;
    lVar14 = uVar8 - 1;
    auVar11._8_4_ = (int)lVar14;
    auVar11._0_8_ = lVar14;
    auVar11._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar9 = 0;
    auVar11 = auVar11 ^ _DAT_00126030;
    auVar13 = _DAT_00126690;
    auVar15 = _DAT_001266a0;
    do {
      auVar16 = auVar15 ^ auVar1;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar12 && auVar11._0_4_ < auVar16._0_4_ ||
                  iVar12 < auVar16._4_4_) & 1)) {
        *(undefined4 *)((long)pfVar6 + uVar9) = 0x3f800000;
      }
      if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
          auVar16._12_4_ <= auVar11._12_4_) {
        *(undefined4 *)((long)pfVar6 + uVar9 + 4) = 0x3f800000;
      }
      auVar16 = auVar13 ^ auVar1;
      iVar17 = auVar16._4_4_;
      if (iVar17 <= iVar12 && (iVar17 != iVar12 || auVar16._0_4_ <= auVar11._0_4_)) {
        *(undefined4 *)((long)pfVar6 + uVar9 + 8) = 0x3f800000;
        *(undefined4 *)((long)pfVar6 + uVar9 + 0xc) = 0x3f800000;
      }
      lVar14 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar14 + 4;
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar14 + 4;
      uVar9 = uVar9 + 0x10;
    } while ((uVar8 * 4 + 0xc & 0xfffffffffffffff0) != uVar9);
  }
  FAudioVoice_SetOutputVoices(voice,pSendList);
  if ((Flags & 8) != 0) {
    pafVar7 = (FAudioFilterState *)(*audio->pMalloc)((ulong)InputChannels << 4);
    (*ppSubmixVoice)->filterState = pafVar7;
    SDL_memset((*ppSubmixVoice)->filterState,0,(ulong)InputChannels << 4);
  }
  FAudio_INTERNAL_InsertSubmixSorted
            (&audio->submixes,*ppSubmixVoice,audio->submixLock,audio->pMalloc);
  audio->refcount = audio->refcount + 1;
  return 0;
}

Assistant:

uint32_t FAudio_CreateSubmixVoice(
	FAudio *audio,
	FAudioSubmixVoice **ppSubmixVoice,
	uint32_t InputChannels,
	uint32_t InputSampleRate,
	uint32_t Flags,
	uint32_t ProcessingStage,
	const FAudioVoiceSends *pSendList,
	const FAudioEffectChain *pEffectChain
) {
	uint32_t i;

	LOG_API_ENTER(audio)

	*ppSubmixVoice = (FAudioSubmixVoice*) audio->pMalloc(sizeof(FAudioVoice));
	FAudio_zero(*ppSubmixVoice, sizeof(FAudioSubmixVoice));
	(*ppSubmixVoice)->audio = audio;
	(*ppSubmixVoice)->type = FAUDIO_VOICE_SUBMIX;
	(*ppSubmixVoice)->flags = Flags;
	(*ppSubmixVoice)->filter.Type = FAUDIO_DEFAULT_FILTER_TYPE;
	(*ppSubmixVoice)->filter.Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
	(*ppSubmixVoice)->filter.OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
	(*ppSubmixVoice)->sendLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->sendLock)
	(*ppSubmixVoice)->effectLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->effectLock)
	(*ppSubmixVoice)->filterLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->filterLock)
	(*ppSubmixVoice)->volumeLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->volumeLock)

	/* Submix Properties */
	(*ppSubmixVoice)->mix.inputChannels = InputChannels;
	(*ppSubmixVoice)->mix.inputSampleRate = InputSampleRate;
	(*ppSubmixVoice)->mix.processingStage = ProcessingStage;

	/* Resampler */
	if (InputChannels == 1)
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleMono;
	}
	else if (InputChannels == 2)
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleStereo;
	}
	else
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleGeneric;
	}

	/* Sample Storage */
	(*ppSubmixVoice)->mix.inputSamples = ((uint32_t) FAudio_ceil(
		audio->updateSize *
		(double) InputSampleRate /
		(double) audio->master->master.inputSampleRate
	) + EXTRA_DECODE_PADDING) * InputChannels;
	(*ppSubmixVoice)->mix.inputCache = (float*) audio->pMalloc(
		sizeof(float) * (*ppSubmixVoice)->mix.inputSamples
	);
	FAudio_zero( /* Zero this now, for the first update */
		(*ppSubmixVoice)->mix.inputCache,
		sizeof(float) * (*ppSubmixVoice)->mix.inputSamples
	);

	/* Sends/Effects */
	FAudio_INTERNAL_VoiceOutputFrequency(*ppSubmixVoice, pSendList);
	FAudioVoice_SetEffectChain(*ppSubmixVoice, pEffectChain);

	/* Default Levels */
	(*ppSubmixVoice)->volume = 1.0f;
	(*ppSubmixVoice)->channelVolume = (float*) audio->pMalloc(
		sizeof(float) * (*ppSubmixVoice)->outputChannels
	);
	for (i = 0; i < (*ppSubmixVoice)->outputChannels; i += 1)
	{
		(*ppSubmixVoice)->channelVolume[i] = 1.0f;
	}

	FAudioVoice_SetOutputVoices(*ppSubmixVoice, pSendList);

	/* Filters */
	if (Flags & FAUDIO_VOICE_USEFILTER)
	{
		(*ppSubmixVoice)->filterState = (FAudioFilterState*) audio->pMalloc(
			sizeof(FAudioFilterState) * InputChannels
		);
		FAudio_zero(
			(*ppSubmixVoice)->filterState,
			sizeof(FAudioFilterState) * InputChannels
		);
	}

	/* Add to list, finally. */
	FAudio_INTERNAL_InsertSubmixSorted(
		&audio->submixes,
		*ppSubmixVoice,
		audio->submixLock,
		audio->pMalloc
	);
	FAudio_AddRef(audio);

	LOG_API_EXIT(audio)
	return 0;
}